

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

sexp_conflict
sexp_utf8_ref(sexp_conflict ctx,sexp_conflict self,sexp_conflict bv,sexp_conflict offset)

{
  undefined1 auVar1 [16];
  byte *pbVar2;
  ulong in_RCX;
  int *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  uchar *p;
  sexp_conflict local_8;
  
  if ((((ulong)in_RDX & 3) == 0) && (*in_RDX == 8)) {
    if ((in_RCX & 1) == 1) {
      auVar1._8_8_ = (long)in_RCX >> 0x3f;
      auVar1._0_8_ = in_RCX & 0xfffffffffffffffe;
      pbVar2 = (byte *)((long)in_RDX + SUB168(auVar1 / SEXT816(2),0) + 0x10);
      if (*pbVar2 < 0x80) {
        local_8 = (sexp_conflict)((ulong)*pbVar2 * 0x100 + 0x1e);
      }
      else if ((*pbVar2 < 0xc0) || (0xf7 < *pbVar2)) {
        local_8 = (sexp_conflict)sexp_user_exception(in_RDI,0,"utf8-ref: invalid utf8 byte",in_RCX);
      }
      else if (*pbVar2 < 0xe0) {
        local_8 = (sexp_conflict)
                  ((long)(int)((*pbVar2 & 0x3f) * 0x40 + (pbVar2[1] & 0x3f)) * 0x100 + 0x1e);
      }
      else if (*pbVar2 < 0xf0) {
        local_8 = (sexp_conflict)
                  ((long)(int)((*pbVar2 & 0x1f) * 0x1000 + (pbVar2[1] & 0x3f) * 0x40 +
                              (pbVar2[2] & 0x3f)) * 0x100 + 0x1e);
      }
      else {
        local_8 = (sexp_conflict)
                  ((long)(int)((*pbVar2 & 0xf) * 0x40000 + (pbVar2[1] & 0x3f) * 0x1000 +
                               (pbVar2[2] & 0x3f) * 0x40 + (pbVar2[3] & 0x3f)) * 0x100 + 0x1e);
      }
    }
    else {
      local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,2,in_RCX);
    }
  }
  else {
    local_8 = (sexp_conflict)sexp_type_exception(in_RDI,in_RSI,8,in_RDX);
  }
  return local_8;
}

Assistant:

sexp sexp_utf8_ref (sexp ctx, sexp self, sexp bv, sexp offset) {
  sexp_assert_type(ctx, sexp_bytesp, SEXP_BYTES, bv);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, offset);
  unsigned char *p=(unsigned char*)sexp_bytes_data(bv) + sexp_unbox_fixnum(offset);
  if (*p < 0x80)
    return sexp_make_character(*p);
  else if ((*p < 0xC0) || (*p > 0xF7))
    return sexp_user_exception(ctx, NULL, "utf8-ref: invalid utf8 byte", offset);
  else if (*p < 0xE0)
    return sexp_make_character(((p[0]&0x3F)<<6) + (p[1]&0x3F));
  else if (*p < 0xF0)
    return sexp_make_character(((p[0]&0x1F)<<12) + ((p[1]&0x3F)<<6) + (p[2]&0x3F));
  else
    return sexp_make_character(((p[0]&0x0F)<<18) + ((p[1]&0x3F)<<12) + ((p[2]&0x3F)<<6) + (p[3]&0x3F));
}